

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O2

bool jessilib::hex_shrink_sequence_action<char,2ul,false,false>
               (char **in_write_head,basic_string_view<char,_std::char_traits<char>_> *read_view)

{
  undefined8 in_RAX;
  size_t sVar1;
  anon_class_1_0_00000001 local_15;
  uint32_t hex_value;
  
  hex_value._0_1_ = (char)((ulong)in_RAX >> 0x20);
  sVar1 = hex_shrink_sequence_action<char,_2UL,_false,_false>::anon_class_1_0_00000001::operator()
                    (&local_15,&hex_value,*read_view,2);
  if (sVar1 != 0) {
    read_view->_M_str = read_view->_M_str + sVar1;
    read_view->_M_len = read_view->_M_len - sVar1;
    **in_write_head = (char)hex_value;
    *in_write_head = *in_write_head + 1;
  }
  return sVar1 != 0;
}

Assistant:

constexpr bool hex_shrink_sequence_action(CharT*& in_write_head, std::basic_string_view<CharT>& read_view) {
	// Does not modify
	auto read_hex = [](uint32_t& out_value, std::basic_string_view<CharT> in_view, size_t max_digits) constexpr {
		size_t result{};
		int hex_value;
		out_value = 0;
		while (result != max_digits
			&& !in_view.empty()) {
			hex_value = as_base(in_view.front(), 16); // hexadecimal characters are always 1 unit
			if (hex_value < 0) {
				// Not a hexadecimal character; push what we have and handle this
				return result;
			}

			out_value <<= 4;
			out_value |= hex_value;

			in_view.remove_prefix(1);
			++result;
		}

		// Number of elements that are hexadecimal digits
		return result;
	};

	// Read in hex value
	uint32_t hex_value;
	size_t units_read = read_hex(hex_value, read_view, MaxDigitsV);

	// Sanity check digits read
	if constexpr(ExactDigitsV) {
		if (units_read != MaxDigitsV) {
			// We expected example MaxDigitsV digits; fail
			return false;
		}
	}
	else {
		if (units_read == 0) {
			// We didn't read any digits; fail
			return false;
		}
	}

	// We read an acceptable number of digits; write the unit and call it a day
	read_view.remove_prefix(units_read);
	if constexpr (IsUnicode) {
		in_write_head += encode_codepoint(in_write_head, hex_value);
	}
	else {
		static_assert(MaxDigitsV <= sizeof(CharT) * 2);
		*in_write_head = static_cast<CharT>(hex_value);
		++in_write_head;
	}

	return true;
}